

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::setFormat(HighsSparseMatrix *this,MatrixFormat desired_format)

{
  if (desired_format == kColwise) {
    ensureColwise(this);
    return;
  }
  ensureRowwise(this);
  return;
}

Assistant:

void HighsSparseMatrix::setFormat(const MatrixFormat desired_format) {
  assert(this->formatOk());
  if (desired_format == MatrixFormat::kColwise) {
    this->ensureColwise();
  } else {
    this->ensureRowwise();
  }
  assert(this->format_ == desired_format);
}